

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O2

Message * __thiscall
proto2_unittest::TestConflictingMethodNames::GetResponsePrototype
          (TestConflictingMethodNames *this,MethodDescriptor *method)

{
  Nullable<const_char_*> failure_msg;
  ServiceDescriptor *local_28 [2];
  ServiceDescriptor *local_18;
  
  local_28[0] = method->service_;
  local_18 = descriptor();
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::ServiceDescriptor_const*,google::protobuf::ServiceDescriptor_const*>
                          (local_28,&local_18,"method->service() == descriptor()");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
               ,0x23bb,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  if ((int)(((long)method - (long)method->service_->methods_) / 0x50) == 0) {
    return (Message *)&_DummyMessage_default_instance_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
             ,0x23c1);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            ((LogMessage *)local_28,(char (*) [44])"Bad method index; this should never happen.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

const ::google::protobuf::Message& TestConflictingMethodNames::GetResponsePrototype(
    const ::google::protobuf::MethodDescriptor* PROTOBUF_NONNULL method) const {
  ABSL_DCHECK_EQ(method->service(), descriptor());
  switch (method->index()) {
    case 0:
      return ::proto2_unittest::DummyMessage::default_instance();

    default:
      ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
      return *::google::protobuf::MessageFactory::generated_factory()->GetPrototype(
          method->output_type());
  }
}